

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>_>::
rehash(Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>_> *this,
      size_t sizeHint)

{
  Entry *key;
  uchar *puVar1;
  ulong uVar2;
  Span *pSVar3;
  AnchorVertex *pAVar4;
  Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *pNVar5;
  ulong uVar6;
  ulong uVar7;
  Span *pSVar8;
  size_t index;
  size_t numBuckets;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  R RVar11;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar9 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar9 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar11 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar11.spans;
  this->numBuckets = numBuckets;
  if (0x7f < uVar2) {
    uVar6 = 0;
    pSVar8 = pSVar3;
    do {
      lVar9 = 0;
      do {
        if ((ulong)pSVar8->offsets[lVar9] != 0xff) {
          key = pSVar3[uVar6].entries + pSVar8->offsets[lVar9];
          local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
          local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
          pAVar4 = *(AnchorVertex **)(key->storage).data;
          uVar7 = ((ulong)pAVar4 >> 0x20 ^ (ulong)pAVar4) * -0x2917014799a6026d;
          uVar7 = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d;
          local_48 = Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>
                     ::findBucketWithHash<QtGraphicsAnchorLayout::AnchorVertex*>
                               ((Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>
                                 *)this,(AnchorVertex **)key,uVar7 >> 0x20 ^ this->seed ^ uVar7);
          pNVar5 = Bucket::insert(&local_48);
          pNVar5->key = *(AnchorVertex **)(key->storage).data;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x80);
      if (pSVar3[uVar6].entries != (Entry *)0x0) {
        operator_delete__(pSVar3[uVar6].entries);
        pSVar3[uVar6].entries = (Entry *)0x0;
      }
      uVar6 = uVar6 + 1;
      pSVar8 = pSVar8 + 1;
    } while (uVar6 != uVar2 >> 7);
  }
  if (pSVar3 != (Span *)0x0) {
    lVar9 = *(long *)&pSVar3[-1].allocated;
    if (lVar9 != 0) {
      lVar10 = lVar9 * 0x90;
      do {
        if (*(void **)(pSVar3->offsets + lVar10 + -0x10) != (void *)0x0) {
          operator_delete__(*(void **)(pSVar3->offsets + lVar10 + -0x10));
          puVar1 = pSVar3->offsets + lVar10 + -0x10;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
        }
        lVar10 = lVar10 + -0x90;
      } while (lVar10 != 0);
    }
    operator_delete__(&pSVar3[-1].allocated,lVar9 * 0x90 + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }